

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::php::TypeName_abi_cxx11_
          (string *__return_storage_ptr__,php *this,FieldDescriptor *field)

{
  undefined4 uVar1;
  char *pcVar2;
  char *pcVar3;
  php *local_20;
  _func_void_FieldDescriptor_ptr *local_18;
  
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    local_18 = FieldDescriptor::TypeOnceInit;
    local_20 = this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),&local_18,(FieldDescriptor **)&local_20);
  }
  uVar1 = *(undefined4 *)(this + 0x38);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(uVar1) {
  case 1:
    pcVar3 = "double";
    pcVar2 = "";
    break;
  case 2:
    pcVar3 = "float";
    pcVar2 = "";
    break;
  case 3:
    pcVar3 = "int64";
    pcVar2 = "";
    break;
  case 4:
    pcVar3 = "uint64";
    pcVar2 = "";
    break;
  case 5:
    pcVar3 = "int32";
    pcVar2 = "";
    break;
  case 6:
    pcVar3 = "fixed64";
    pcVar2 = "";
    break;
  case 7:
    pcVar3 = "fixed32";
    pcVar2 = "";
    break;
  case 8:
    pcVar3 = "bool";
    pcVar2 = "";
    break;
  case 9:
    pcVar3 = "string";
    pcVar2 = "";
    break;
  case 10:
    pcVar3 = "group";
    pcVar2 = "";
    break;
  case 0xb:
    pcVar3 = "message";
    pcVar2 = "";
    break;
  case 0xc:
    pcVar3 = "bytes";
    pcVar2 = "";
    break;
  case 0xd:
    pcVar3 = "uint32";
    pcVar2 = "";
    break;
  case 0xe:
    pcVar3 = "enum";
    pcVar2 = "";
    break;
  case 0xf:
    pcVar3 = "sfixed32";
    pcVar2 = "";
    break;
  case 0x10:
    pcVar3 = "sfixed64";
    pcVar2 = "";
    break;
  case 0x11:
    pcVar3 = "sint32";
    pcVar2 = "";
    break;
  case 0x12:
    pcVar3 = "sint64";
    pcVar2 = "";
    break;
  default:
    pcVar2 = "";
    pcVar3 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string TypeName(const FieldDescriptor* field) {
  switch (field->type()) {
    case FieldDescriptor::TYPE_INT32: return "int32";
    case FieldDescriptor::TYPE_INT64: return "int64";
    case FieldDescriptor::TYPE_UINT32: return "uint32";
    case FieldDescriptor::TYPE_UINT64: return "uint64";
    case FieldDescriptor::TYPE_SINT32: return "sint32";
    case FieldDescriptor::TYPE_SINT64: return "sint64";
    case FieldDescriptor::TYPE_FIXED32: return "fixed32";
    case FieldDescriptor::TYPE_FIXED64: return "fixed64";
    case FieldDescriptor::TYPE_SFIXED32: return "sfixed32";
    case FieldDescriptor::TYPE_SFIXED64: return "sfixed64";
    case FieldDescriptor::TYPE_DOUBLE: return "double";
    case FieldDescriptor::TYPE_FLOAT: return "float";
    case FieldDescriptor::TYPE_BOOL: return "bool";
    case FieldDescriptor::TYPE_ENUM: return "enum";
    case FieldDescriptor::TYPE_STRING: return "string";
    case FieldDescriptor::TYPE_BYTES: return "bytes";
    case FieldDescriptor::TYPE_MESSAGE: return "message";
    case FieldDescriptor::TYPE_GROUP: return "group";
    default: assert(false); return "";
  }
}